

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeutils.cpp
# Opt level: O0

frame * read_frame_from_pipe(frame *__return_storage_ptr__,pipestruct p)

{
  string local_60 [32];
  pipestruct local_40;
  string local_38 [8];
  string f_str;
  pipestruct p_local;
  
  local_40 = p;
  read_pipe_abi_cxx11_((pipestruct)local_38);
  std::__cxx11::string::string(local_60,local_38);
  frame_from_string(__return_storage_ptr__,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

frame read_frame_from_pipe(pipestruct p) {
	string f_str = read_pipe(p);
	return frame_from_string(f_str);
}